

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_7::Validator::CheckImport(Validator *this,Location *loc,Import *import)

{
  bool bVar1;
  ExternalKind EVar2;
  ExceptionImport *pEVar3;
  FuncImport *pFVar4;
  TableImport *pTVar5;
  MemoryImport *pMVar6;
  GlobalImport *pGVar7;
  GlobalImport *global_import;
  FuncImport *func_import;
  Import *import_local;
  Location *loc_local;
  Validator *this_local;
  
  EVar2 = Import::kind(import);
  switch(EVar2) {
  case First:
    pFVar4 = cast<wabt::FuncImport,wabt::Import>(import);
    if (((pFVar4->func).decl.has_func_type & 1U) != 0) {
      CheckFuncTypeVar(this,&(pFVar4->func).decl.type_var,(FuncType **)0x0);
    }
    break;
  case Table:
    pTVar5 = cast<wabt::TableImport,wabt::Import>(import);
    CheckTable(this,loc,&pTVar5->table);
    this->current_table_index_ = this->current_table_index_ + 1;
    break;
  case Memory:
    pMVar6 = cast<wabt::MemoryImport,wabt::Import>(import);
    CheckMemory(this,loc,&pMVar6->memory);
    this->current_memory_index_ = this->current_memory_index_ + 1;
    break;
  case Global:
    pGVar7 = cast<wabt::GlobalImport,wabt::Import>(import);
    if ((((pGVar7->global).mutable_ & 1U) != 0) &&
       (bVar1 = Features::mutable_globals_enabled(&this->options_->features), !bVar1)) {
      PrintError(this,loc,"mutable globals cannot be imported");
    }
    this->num_imported_globals_ = this->num_imported_globals_ + 1;
    this->current_global_index_ = this->current_global_index_ + 1;
    break;
  case Except:
    this->current_except_index_ = this->current_except_index_ + 1;
    pEVar3 = cast<wabt::ExceptionImport,wabt::Import>(import);
    CheckExcept(this,loc,&pEVar3->except);
  }
  return;
}

Assistant:

void Validator::CheckImport(const Location* loc, const Import* import) {
  switch (import->kind()) {
    case ExternalKind::Except:
      ++current_except_index_;
      CheckExcept(loc, &cast<ExceptionImport>(import)->except);
      break;

    case ExternalKind::Func: {
      auto* func_import = cast<FuncImport>(import);
      if (func_import->func.decl.has_func_type) {
        CheckFuncTypeVar(&func_import->func.decl.type_var, nullptr);
      }
      break;
    }

    case ExternalKind::Table:
      CheckTable(loc, &cast<TableImport>(import)->table);
      ++current_table_index_;
      break;

    case ExternalKind::Memory:
      CheckMemory(loc, &cast<MemoryImport>(import)->memory);
      ++current_memory_index_;
      break;

    case ExternalKind::Global: {
      auto* global_import = cast<GlobalImport>(import);
      if (global_import->global.mutable_ &&
          !options_.features.mutable_globals_enabled()) {
        PrintError(loc, "mutable globals cannot be imported");
      }
      ++num_imported_globals_;
      ++current_global_index_;
      break;
    }
  }
}